

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O2

void anon_unknown.dwarf_1e8795::generatePixel(int i,int j,half *rgbaValue,bool pIsLeft)

{
  float f;
  float fVar1;
  float fVar2;
  int iVar3;
  undefined7 in_register_00000009;
  int iVar4;
  float fVar5;
  float fVar6;
  
  fVar6 = (float)j;
  if ((int)CONCAT71(in_register_00000009,pIsLeft) == 0) {
    fVar5 = fVar6 * 0.005 + (float)((j * i) % 10);
    iVar3 = i * 2;
    iVar4 = i * i + j;
    fVar1 = 0.007;
    fVar2 = 0.006;
  }
  else {
    fVar5 = fVar6 * 0.004 + (float)((j + i) % 10);
    iVar3 = j * 2;
    iVar4 = j * j + i;
    fVar1 = 0.006;
    fVar2 = 0.003;
  }
  f = *(float *)((long)&half::_toFloat + (ulong)(anonymous_namespace)::ALPHA_DEFAULT_VALUE * 4);
  half::operator=(rgbaValue,fVar5 / 10.0);
  half::operator=(rgbaValue + 1,((float)i * fVar1 + (float)(iVar3 % 10)) / 10.0);
  half::operator=(rgbaValue + 2,(fVar6 * fVar2 + (float)(iVar4 % 10)) / 10.0);
  half::operator=(rgbaValue + 3,f);
  return;
}

Assistant:

void
generatePixel (int i, int j, half* rgbaValue, bool pIsLeft)
{
    float redValue = 0.0f;
    float greenValue = 0.0f;
    float blueValue = 0.0f;
    float alphaValue = 0.0f;

    // These formulas are arbitrary but generate results that vary
    // depending on pixel position.  They are used to validate that
    // pixels are read/written correctly, because if we had only one
    // value for the whole image, the tests would still pass if we read
    // only one pixel and copied it all across the buffer.
    if(pIsLeft)
    {
        redValue = ((i + j) % 10 + 0.004f * j) / 10.0f;
        greenValue = ((j + j) % 10 + 0.006f * i) / 10.0f;
        blueValue = ((j * j + i) % 10 + 0.003f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }
    else
    {
        redValue = ((i * j) % 10 + 0.005f * j) / 10.0f;
        greenValue = ((i + i) % 10 + 0.007f * i) / 10.0f;
        blueValue = ((i * i + j) % 10 + 0.006f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }


    rgbaValue[0] = redValue;
    rgbaValue[1] = greenValue;
    rgbaValue[2] = blueValue;
    rgbaValue[3] = alphaValue;
}